

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::remove
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,char *__filename)

{
  int iVar1;
  int iVar2;
  undefined8 unaff_RBP;
  long lVar4;
  long lVar5;
  undefined8 uVar3;
  
  uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),0 < this->num_elements);
  iVar2 = (int)uVar3;
  if (0 < this->num_elements) {
    iVar1 = mem_comp(this->list,__filename,200);
    if (iVar1 == 0) {
      lVar5 = 0;
    }
    else {
      lVar4 = 200;
      lVar5 = 0;
      do {
        lVar5 = lVar5 + 1;
        uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),lVar5 < this->num_elements);
        iVar2 = (int)uVar3;
        if (this->num_elements <= lVar5) {
          return iVar2;
        }
        iVar1 = mem_comp(this->list->m_aName + lVar4 + -4,__filename,200);
        lVar4 = lVar4 + 200;
      } while (iVar1 != 0);
    }
    remove_index(this,(int)lVar5);
  }
  return iVar2;
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}